

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * __thiscall
flatbuffers::dart::DartGenerator::GenDartTypeName
          (string *__return_storage_ptr__,DartGenerator *this,Type *type,
          Namespace *current_namespace,FieldDef *def,string *struct_type_suffix)

{
  string *def_00;
  FieldDef *current_namespace_00;
  string local_130;
  Type local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_69;
  allocator<char> local_68;
  allocator<char> local_67;
  allocator<char> local_66;
  allocator<char> local_65 [13];
  string local_58;
  string *local_38;
  string *struct_type_suffix_local;
  FieldDef *def_local;
  Namespace *current_namespace_local;
  Type *type_local;
  DartGenerator *this_local;
  
  local_38 = struct_type_suffix;
  struct_type_suffix_local = (string *)def;
  def_local = (FieldDef *)current_namespace;
  current_namespace_local = (Namespace *)type;
  type_local = (Type *)this;
  this_local = (DartGenerator *)__return_storage_ptr__;
  if (type->enum_def != (EnumDef *)0x0) {
    if (((type->enum_def->is_union & 1U) != 0) && (type->base_type != BASE_TYPE_UNION)) {
      IdlNamer::Type_abi_cxx11_(&local_58,&this->namer_,type->enum_def);
      std::operator+(__return_storage_ptr__,&local_58,"TypeId");
      std::__cxx11::string::~string((string *)&local_58);
      return __return_storage_ptr__;
    }
    if ((type->enum_def->is_union & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"dynamic",local_65);
      std::allocator<char>::~allocator(local_65);
      return __return_storage_ptr__;
    }
    if (type->base_type != BASE_TYPE_VECTOR) {
      IdlNamer::Type_abi_cxx11_(__return_storage_ptr__,&this->namer_,type->enum_def);
      return __return_storage_ptr__;
    }
  }
  switch(type->base_type) {
  case BASE_TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bool",&local_66);
    std::allocator<char>::~allocator(&local_66);
    break;
  case BASE_TYPE_CHAR:
  case BASE_TYPE_UCHAR:
  case BASE_TYPE_SHORT:
  case BASE_TYPE_USHORT:
  case BASE_TYPE_INT:
  case BASE_TYPE_UINT:
  case BASE_TYPE_LONG:
  case BASE_TYPE_ULONG:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_67);
    std::allocator<char>::~allocator(&local_67);
    break;
  case BASE_TYPE_FLOAT:
  case BASE_TYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"double",&local_68);
    std::allocator<char>::~allocator(&local_68);
    break;
  case BASE_TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"String",&local_69);
    std::allocator<char>::~allocator(&local_69);
    break;
  case BASE_TYPE_VECTOR:
    Type::VectorType(&local_110,type);
    current_namespace_00 = def_local;
    def_00 = struct_type_suffix_local;
    std::__cxx11::string::string((string *)&local_130,(string *)struct_type_suffix);
    GenDartTypeName(&local_f0,this,&local_110,(Namespace *)current_namespace_00,(FieldDef *)def_00,
                    &local_130);
    std::operator+(&local_d0,"List<",&local_f0);
    std::operator+(__return_storage_ptr__,&local_d0,">");
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_130);
    break;
  case BASE_TYPE_STRUCT:
    IdlNamer::Type_abi_cxx11_(&local_b0,&this->namer_,type->struct_def);
    std::operator+(&local_90,&local_b0,struct_type_suffix);
    MaybeWrapNamespace(__return_storage_ptr__,this,&local_90,(Namespace *)def_local,
                       (FieldDef *)struct_type_suffix_local);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_dart.cpp"
                  ,0x18b,
                  "std::string flatbuffers::dart::DartGenerator::GenDartTypeName(const Type &, Namespace *, const FieldDef &, std::string)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDartTypeName(const Type &type, Namespace *current_namespace,
                              const FieldDef &def,
                              std::string struct_type_suffix = "") {
    if (type.enum_def) {
      if (type.enum_def->is_union && type.base_type != BASE_TYPE_UNION) {
        return namer_.Type(*type.enum_def) + "TypeId";
      } else if (type.enum_def->is_union) {
        return "dynamic";
      } else if (type.base_type != BASE_TYPE_VECTOR) {
        return namer_.Type(*type.enum_def);
      }
    }

    switch (type.base_type) {
      case BASE_TYPE_BOOL: return "bool";
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG:
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT:
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT:
      case BASE_TYPE_CHAR:
      case BASE_TYPE_UCHAR: return "int";
      case BASE_TYPE_FLOAT:
      case BASE_TYPE_DOUBLE: return "double";
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_STRUCT:
        return MaybeWrapNamespace(
            namer_.Type(*type.struct_def) + struct_type_suffix,
            current_namespace, def);
      case BASE_TYPE_VECTOR:
        return "List<" +
               GenDartTypeName(type.VectorType(), current_namespace, def,
                               struct_type_suffix) +
               ">";
      default: assert(0); return "dynamic";
    }
  }